

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

void __thiscall
duckdb::PipelineTask::PipelineTask
          (PipelineTask *this,Pipeline *pipeline_p,shared_ptr<duckdb::Event,_true> *event_p)

{
  Executor *pEVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  pEVar1 = pipeline_p->executor;
  peVar2 = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExecutorTask).super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.
  internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ExecutorTask).super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.
  internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExecutorTask).super_Task.token.ptr = (ProducerToken *)0x0;
  (this->super_ExecutorTask).super_Task._vptr_Task = (_func_int **)&PTR__ExecutorTask_024b1448;
  (this->super_ExecutorTask).executor = pEVar1;
  (this->super_ExecutorTask).event.internal.
  super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->super_ExecutorTask).event.internal.
  super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  (this->super_ExecutorTask).thread_context.
  super_unique_ptr<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super___uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>.
  super__Head_base<0UL,_duckdb::ThreadContext_*,_false>._M_head_impl = (ThreadContext *)0x0;
  (this->super_ExecutorTask).op.ptr = (PhysicalOperator *)0x0;
  (this->super_ExecutorTask).context = pEVar1->context;
  LOCK();
  (pEVar1->executor_tasks).super___atomic_base<unsigned_long>._M_i =
       (pEVar1->executor_tasks).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  (this->super_ExecutorTask).super_Task._vptr_Task = (_func_int **)&PTR__PipelineTask_024b1490;
  this->pipeline = pipeline_p;
  (this->pipeline_executor).
  super_unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>._M_t.
  super___uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::PipelineExecutor_*,_std::default_delete<duckdb::PipelineExecutor>_>
  .super__Head_base<0UL,_duckdb::PipelineExecutor_*,_false>._M_head_impl = (PipelineExecutor *)0x0;
  return;
}

Assistant:

PipelineTask::PipelineTask(Pipeline &pipeline_p, shared_ptr<Event> event_p)
    : ExecutorTask(pipeline_p.executor, std::move(event_p)), pipeline(pipeline_p) {
}